

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O2

void __thiscall
Clasp::mt::SharedLitsClause::destroy(SharedLitsClause *this,Solver *s,bool detachFirst)

{
  uint64 uVar1;
  Chunk *b;
  
  if (s != (Solver *)0x0) {
    if (detachFirst) {
      ClauseHead::detach(&this->super_ClauseHead,s);
    }
    if (((this->super_ClauseHead).info_.super_ConstraintScore.rep & 0x30000000) != 0) {
      uVar1 = 0;
      if (0x1f < s->memUse_) {
        uVar1 = s->memUse_ - 0x20;
      }
      s->memUse_ = uVar1;
    }
    SharedLiterals::release((this->super_ClauseHead).field_0.shared_);
    (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[0x10])(this);
    (this->super_ClauseHead).super_Constraint._vptr_Constraint =
         (_func_int **)(s->smallAlloc_).freeList_;
    (s->smallAlloc_).freeList_ = (Chunk *)this;
    return;
  }
  SharedLiterals::release((this->super_ClauseHead).field_0.shared_);
  (*(this->super_ClauseHead).super_Constraint._vptr_Constraint[0x10])(this);
  return;
}

Assistant:

void SharedLitsClause::destroy(Solver* s, bool detachFirst) {
	if (s) {
		if (detachFirst) { ClauseHead::detach(*s); }
		if (learnt())    { s->freeLearntBytes(32); }
	}
	shared_->release();
	void* mem = this;
	this->~SharedLitsClause();
	if (s) { s->freeSmall(mem); }
}